

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O2

size_t ZSTD_decompressStream(ZSTD_DStream *zds,ZSTD_outBuffer *output,ZSTD_inBuffer *input)

{
  uint uVar1;
  int iVar2;
  ZSTD_customMem *pZVar3;
  ZSTD_nextInputType_e ZVar4;
  ZSTD_DDict *pZVar5;
  char *pcVar6;
  size_t sVar7;
  size_t sVar8;
  bool bVar9;
  ZSTD_dStage ZVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  size_t __n;
  void *src;
  void *pvVar15;
  size_t bufferSize;
  ZSTD_frameSizeInfo ZVar16;
  char *op;
  char *local_b0;
  void *local_a8;
  ZSTD_frameHeader *local_a0;
  BYTE *local_98;
  void *local_90;
  size_t *local_88;
  ZSTD_inBuffer *local_80;
  ZSTD_outBuffer *local_78;
  ZSTD_outBuffer *local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  char *local_40;
  ZSTD_customMem *local_38;
  
  local_50 = input->pos;
  local_58 = input->size;
  pvVar15 = output->dst;
  local_60 = output->size;
  local_68 = output->pos;
  op = (char *)((long)pvVar15 + local_68);
  sVar8 = 0xffffffffffffffb8;
  local_48 = local_58 - local_50;
  if ((local_50 <= local_58) && (sVar8 = 0xffffffffffffffba, local_68 <= local_60)) {
    if ((zds->outBufferMode == ZSTD_bm_stable) && (zds->streamStage != zdss_init)) {
      if ((zds->expectedOutBuffer).dst != pvVar15) {
        return 0xffffffffffffff98;
      }
      if ((zds->expectedOutBuffer).pos != local_68) {
        return 0xffffffffffffff98;
      }
      if ((zds->expectedOutBuffer).size != local_60) {
        return 0xffffffffffffff98;
      }
    }
    local_90 = (void *)((long)input->src + local_50);
    local_a8 = (void *)((long)input->src + local_58);
    local_b0 = (char *)((long)pvVar15 + local_60);
    local_78 = &zds->expectedOutBuffer;
    local_88 = &zds->outStart;
    local_a0 = &zds->fParams;
    local_98 = zds->headerBuffer;
    local_38 = &zds->customMem;
    bVar9 = false;
    pvVar15 = local_90;
    local_80 = input;
    local_70 = output;
    local_40 = op;
LAB_00200313:
    do {
      src = pvVar15;
      pcVar6 = op;
      if (bVar9) {
        local_80->pos = (long)src - (long)local_80->src;
        sVar8 = (long)op - (long)local_70->dst;
        local_70->pos = sVar8;
        local_78->pos = sVar8;
        sVar8 = local_70->size;
        local_78->dst = local_70->dst;
        local_78->size = sVar8;
        if (local_40 == op && local_90 == src) {
          iVar2 = zds->noForwardProgress;
          zds->noForwardProgress = iVar2 + 1;
          if (0xe < iVar2) {
            if (local_68 == local_60) {
              return 0xffffffffffffffba;
            }
            if (local_58 == local_50) {
              return 0xffffffffffffffb8;
            }
          }
        }
        else {
          zds->noForwardProgress = 0;
        }
        sVar8 = zds->expected;
        if (sVar8 != 0) {
          ZVar4 = ZSTD_nextInputType(zds);
          return (sVar8 - zds->inPos) + (ulong)(ZVar4 == ZSTDnit_block) * 3;
        }
        if (zds->outEnd != zds->outStart) {
          if (zds->hostageByte == 0) {
            local_80->pos = local_80->pos - 1;
            zds->hostageByte = 1;
            return 1;
          }
          return 1;
        }
        if (zds->hostageByte != 0) {
          if (local_80->size <= local_80->pos) {
            zds->streamStage = zdss_read;
            return 1;
          }
          local_80->pos = local_80->pos + 1;
        }
        return 0;
      }
      pvVar15 = src;
      switch(zds->streamStage) {
      case zdss_init:
        zds->streamStage = zdss_loadHeader;
        zds->inPos = 0;
        zds->legacyVersion = 0;
        zds->hostageByte = 0;
        *local_88 = 0;
        local_88[1] = 0;
        local_88[2] = 0;
        local_78->pos = local_70->pos;
        sVar8 = local_70->size;
        local_78->dst = local_70->dst;
        local_78->size = sVar8;
        sVar8 = 0;
        break;
      case zdss_loadHeader:
        sVar8 = zds->lhSize;
        break;
      case zdss_read:
        goto switchD_0020033d_caseD_2;
      case zdss_load:
        goto switchD_0020033d_caseD_3;
      case zdss_flush:
        sVar8 = zds->outStart;
        uVar14 = zds->outEnd - sVar8;
        uVar12 = (long)local_b0 - (long)op;
        uVar13 = uVar14;
        if (uVar12 < uVar14) {
          uVar13 = uVar12;
        }
        if (uVar13 != 0) {
          memcpy(op,zds->outBuff + sVar8,uVar13);
          sVar8 = zds->outStart;
        }
        op = pcVar6 + uVar13;
        *local_88 = sVar8 + uVar13;
        bVar9 = true;
        if (uVar14 <= uVar12) {
          zds->streamStage = zdss_read;
          bVar9 = false;
          if ((zds->outBuffSize < (zds->fParams).frameContentSize) &&
             (bVar9 = false, zds->outBuffSize < sVar8 + uVar13 + (ulong)(zds->fParams).blockSizeMax)
             ) {
            *local_88 = 0;
            local_88[1] = 0;
            goto LAB_002004ba;
          }
        }
        goto LAB_00200313;
      default:
        return 0xffffffffffffffff;
      }
      sVar8 = ZSTD_getFrameHeader_advanced(local_a0,local_98,sVar8,zds->format);
      if ((zds->refMultipleDDicts != ZSTD_rmd_refSingleDDict) &&
         (zds->ddictSet != (ZSTD_DDictHashSet *)0x0)) {
        ZSTD_DCtx_selectFrameDDict(zds);
      }
      uVar13 = local_48;
      pcVar6 = op;
      if (0xffffffffffffff88 < sVar8) {
        return sVar8;
      }
      if (sVar8 != 0) {
        sVar7 = zds->lhSize;
        uVar13 = sVar8 - sVar7;
        uVar12 = (long)local_a8 - (long)src;
        if (uVar12 < uVar13) {
          if (local_a8 != src) {
            memcpy(local_98 + sVar7,src,uVar12);
            sVar7 = uVar12 + zds->lhSize;
            zds->lhSize = sVar7;
          }
          local_80->pos = local_80->size;
          uVar13 = (ulong)(zds->format == ZSTD_f_zstd1) * 4 + 2;
          if (sVar8 < uVar13) {
            sVar8 = uVar13;
          }
          return (sVar8 - sVar7) + 3;
        }
        memcpy(local_98 + sVar7,src,uVar13);
        zds->lhSize = sVar8;
        src = (void *)((long)src + uVar13);
LAB_002004ba:
        bVar9 = false;
        pvVar15 = src;
        goto LAB_00200313;
      }
      if (((local_a0->frameContentSize != 0xffffffffffffffff) &&
          ((zds->fParams).frameType != ZSTD_skippableFrame)) &&
         (uVar12 = (long)local_b0 - (long)op, local_a0->frameContentSize <= uVar12)) {
        ZVar16 = ZSTD_findFrameSizeInfo(local_90,local_48);
        uVar14 = ZVar16.compressedSize;
        if (uVar14 <= uVar13) {
          pZVar5 = ZSTD_getDDict(zds);
          pvVar15 = local_90;
          sVar8 = ZSTD_decompress_usingDDict(zds,pcVar6,uVar12,local_90,uVar14,pZVar5);
          if (0xffffffffffffff88 < sVar8) {
            return sVar8;
          }
          op = pcVar6 + sVar8;
          zds->expected = 0;
          zds->streamStage = zdss_init;
          bVar9 = true;
          pvVar15 = (void *)(uVar14 + (long)pvVar15);
          goto LAB_00200313;
        }
      }
      if (((zds->outBufferMode == ZSTD_bm_stable) &&
          ((zds->fParams).frameType != ZSTD_skippableFrame)) &&
         ((local_a0->frameContentSize != 0xffffffffffffffff &&
          ((ulong)((long)local_b0 - (long)op) < local_a0->frameContentSize)))) {
        return 0xffffffffffffffba;
      }
      pZVar5 = ZSTD_getDDict(zds);
      ZSTD_decompressBegin_usingDDict(zds,pZVar5);
      if ((*(uint *)zds->headerBuffer & 0xfffffff0) == 0x184d2a50) {
        uVar13 = (ulong)*(uint *)(zds->headerBuffer + 4);
        ZVar10 = ZSTDds_skipFrame;
      }
      else {
        sVar8 = ZSTD_decodeFrameHeader(zds,local_98,zds->lhSize);
        uVar13 = 3;
        ZVar10 = ZSTDds_decodeBlockHeader;
        if (0xffffffffffffff88 < sVar8) {
          return sVar8;
        }
      }
      pZVar3 = local_38;
      zds->expected = uVar13;
      zds->stage = ZVar10;
      uVar13 = (zds->fParams).windowSize;
      if (uVar13 < 0x401) {
        uVar13 = 0x400;
      }
      (zds->fParams).windowSize = uVar13;
      if (zds->maxWindowSize < uVar13) {
        return 0xfffffffffffffff0;
      }
      uVar1 = (zds->fParams).blockSizeMax;
      uVar12 = (ulong)uVar1;
      if (uVar1 < 5) {
        uVar12 = 4;
      }
      if (zds->outBufferMode == ZSTD_bm_buffered) {
        uVar14 = 0x20000;
        if (uVar13 < 0x20000) {
          uVar14 = uVar13;
        }
        uVar14 = uVar13 + uVar14 + 0x40;
        uVar13 = local_a0->frameContentSize;
        if (uVar14 < local_a0->frameContentSize) {
          uVar13 = uVar14;
        }
      }
      else {
        uVar13 = 0;
      }
      uVar14 = uVar13 + uVar12;
      if (zds->outBuffSize + zds->inBuffSize < uVar14 * 3) {
        uVar11 = 0;
      }
      else {
        uVar11 = zds->oversizedDuration + 1;
      }
      zds->oversizedDuration = uVar11;
      if ((zds->inBuffSize < uVar12) || (0x7f < uVar11 || zds->outBuffSize < uVar13)) {
        if (zds->staticSize == 0) {
          ZSTD_customFree(zds->inBuff,*local_38);
          zds->inBuffSize = 0;
          zds->outBuffSize = 0;
          pcVar6 = (char *)ZSTD_customMalloc(uVar14,*pZVar3);
          zds->inBuff = pcVar6;
          if (pcVar6 == (char *)0x0) {
            return 0xffffffffffffffc0;
          }
        }
        else {
          if (zds->staticSize - 0x276d8 < uVar14) {
            return 0xffffffffffffffc0;
          }
          pcVar6 = zds->inBuff;
        }
        zds->inBuffSize = uVar12;
        zds->outBuff = pcVar6 + uVar12;
        zds->outBuffSize = uVar13;
      }
      zds->streamStage = zdss_read;
switchD_0020033d_caseD_2:
      uVar13 = (long)local_a8 - (long)src;
      sVar7 = ZSTD_nextSrcSizeToDecompressWithInputSize(zds,uVar13);
      if (sVar7 == 0) {
        zds->streamStage = zdss_init;
        bVar9 = true;
        goto LAB_00200313;
      }
      if (uVar13 < sVar7) {
        bVar9 = true;
        pvVar15 = local_a8;
        if (src == local_a8) goto LAB_00200313;
        zds->streamStage = zdss_load;
switchD_0020033d_caseD_3:
        sVar8 = zds->expected;
        sVar7 = zds->inPos;
        uVar13 = sVar8 - sVar7;
        if (zds->stage == ZSTDds_skipFrame) {
          __n = (long)local_a8 - (long)src;
          if (uVar13 < (ulong)((long)local_a8 - (long)src)) {
            __n = uVar13;
          }
        }
        else {
          if (zds->inBuffSize - sVar7 < uVar13) {
            return 0xffffffffffffffec;
          }
          __n = (long)local_a8 - (long)src;
          if (uVar13 < (ulong)((long)local_a8 - (long)src)) {
            __n = uVar13;
          }
          if (__n == 0) {
            __n = 0;
          }
          else {
            memcpy(zds->inBuff + sVar7,src,__n);
            sVar7 = zds->inPos;
          }
        }
        pvVar15 = (void *)((long)src + __n);
        zds->inPos = sVar7 + __n;
        bVar9 = true;
        if (__n < uVar13) goto LAB_00200313;
        zds->inPos = 0;
        sVar8 = ZSTD_decompressContinueStream(zds,&op,local_b0,zds->inBuff,sVar8);
      }
      else {
        sVar8 = ZSTD_decompressContinueStream(zds,&op,local_b0,src,sVar7);
        pvVar15 = (void *)((long)src + sVar7);
      }
      bVar9 = false;
    } while (sVar8 < 0xffffffffffffff89);
  }
  return sVar8;
}

Assistant:

size_t ZSTD_decompressStream(ZSTD_DStream* zds, ZSTD_outBuffer* output, ZSTD_inBuffer* input)
{
    const char* const src = (const char*)input->src;
    const char* const istart = input->pos != 0 ? src + input->pos : src;
    const char* const iend = input->size != 0 ? src + input->size : src;
    const char* ip = istart;
    char* const dst = (char*)output->dst;
    char* const ostart = output->pos != 0 ? dst + output->pos : dst;
    char* const oend = output->size != 0 ? dst + output->size : dst;
    char* op = ostart;
    U32 someMoreWork = 1;

    DEBUGLOG(5, "ZSTD_decompressStream");
    RETURN_ERROR_IF(
        input->pos > input->size,
        srcSize_wrong,
        "forbidden. in: pos: %u   vs size: %u",
        (U32)input->pos, (U32)input->size);
    RETURN_ERROR_IF(
        output->pos > output->size,
        dstSize_tooSmall,
        "forbidden. out: pos: %u   vs size: %u",
        (U32)output->pos, (U32)output->size);
    DEBUGLOG(5, "input size : %u", (U32)(input->size - input->pos));
    FORWARD_IF_ERROR(ZSTD_checkOutBuffer(zds, output), "");

    while (someMoreWork) {
        switch(zds->streamStage)
        {
        case zdss_init :
            DEBUGLOG(5, "stage zdss_init => transparent reset ");
            zds->streamStage = zdss_loadHeader;
            zds->lhSize = zds->inPos = zds->outStart = zds->outEnd = 0;
            zds->legacyVersion = 0;
            zds->hostageByte = 0;
            zds->expectedOutBuffer = *output;
            /* fall-through */

        case zdss_loadHeader :
            DEBUGLOG(5, "stage zdss_loadHeader (srcSize : %u)", (U32)(iend - ip));
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT>=1)
            if (zds->legacyVersion) {
                RETURN_ERROR_IF(zds->staticSize, memory_allocation,
                    "legacy support is incompatible with static dctx");
                {   size_t const hint = ZSTD_decompressLegacyStream(zds->legacyContext, zds->legacyVersion, output, input);
                    if (hint==0) zds->streamStage = zdss_init;
                    return hint;
            }   }
#endif
            {   size_t const hSize = ZSTD_getFrameHeader_advanced(&zds->fParams, zds->headerBuffer, zds->lhSize, zds->format);
                if (zds->refMultipleDDicts && zds->ddictSet) {
                    ZSTD_DCtx_selectFrameDDict(zds);
                }
                DEBUGLOG(5, "header size : %u", (U32)hSize);
                if (ZSTD_isError(hSize)) {
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT>=1)
                    U32 const legacyVersion = ZSTD_isLegacy(istart, iend-istart);
                    if (legacyVersion) {
                        ZSTD_DDict const* const ddict = ZSTD_getDDict(zds);
                        const void* const dict = ddict ? ZSTD_DDict_dictContent(ddict) : NULL;
                        size_t const dictSize = ddict ? ZSTD_DDict_dictSize(ddict) : 0;
                        DEBUGLOG(5, "ZSTD_decompressStream: detected legacy version v0.%u", legacyVersion);
                        RETURN_ERROR_IF(zds->staticSize, memory_allocation,
                            "legacy support is incompatible with static dctx");
                        FORWARD_IF_ERROR(ZSTD_initLegacyStream(&zds->legacyContext,
                                    zds->previousLegacyVersion, legacyVersion,
                                    dict, dictSize), "");
                        zds->legacyVersion = zds->previousLegacyVersion = legacyVersion;
                        {   size_t const hint = ZSTD_decompressLegacyStream(zds->legacyContext, legacyVersion, output, input);
                            if (hint==0) zds->streamStage = zdss_init;   /* or stay in stage zdss_loadHeader */
                            return hint;
                    }   }
#endif
                    return hSize;   /* error */
                }
                if (hSize != 0) {   /* need more input */
                    size_t const toLoad = hSize - zds->lhSize;   /* if hSize!=0, hSize > zds->lhSize */
                    size_t const remainingInput = (size_t)(iend-ip);
                    assert(iend >= ip);
                    if (toLoad > remainingInput) {   /* not enough input to load full header */
                        if (remainingInput > 0) {
                            ZSTD_memcpy(zds->headerBuffer + zds->lhSize, ip, remainingInput);
                            zds->lhSize += remainingInput;
                        }
                        input->pos = input->size;
                        return (MAX((size_t)ZSTD_FRAMEHEADERSIZE_MIN(zds->format), hSize) - zds->lhSize) + ZSTD_blockHeaderSize;   /* remaining header bytes + next block header */
                    }
                    assert(ip != NULL);
                    ZSTD_memcpy(zds->headerBuffer + zds->lhSize, ip, toLoad); zds->lhSize = hSize; ip += toLoad;
                    break;
            }   }

            /* check for single-pass mode opportunity */
            if (zds->fParams.frameContentSize != ZSTD_CONTENTSIZE_UNKNOWN
                && zds->fParams.frameType != ZSTD_skippableFrame
                && (U64)(size_t)(oend-op) >= zds->fParams.frameContentSize) {
                size_t const cSize = ZSTD_findFrameCompressedSize(istart, (size_t)(iend-istart));
                if (cSize <= (size_t)(iend-istart)) {
                    /* shortcut : using single-pass mode */
                    size_t const decompressedSize = ZSTD_decompress_usingDDict(zds, op, (size_t)(oend-op), istart, cSize, ZSTD_getDDict(zds));
                    if (ZSTD_isError(decompressedSize)) return decompressedSize;
                    DEBUGLOG(4, "shortcut to single-pass ZSTD_decompress_usingDDict()")
                    ip = istart + cSize;
                    op += decompressedSize;
                    zds->expected = 0;
                    zds->streamStage = zdss_init;
                    someMoreWork = 0;
                    break;
            }   }

            /* Check output buffer is large enough for ZSTD_odm_stable. */
            if (zds->outBufferMode == ZSTD_bm_stable
                && zds->fParams.frameType != ZSTD_skippableFrame
                && zds->fParams.frameContentSize != ZSTD_CONTENTSIZE_UNKNOWN
                && (U64)(size_t)(oend-op) < zds->fParams.frameContentSize) {
                RETURN_ERROR(dstSize_tooSmall, "ZSTD_obm_stable passed but ZSTD_outBuffer is too small");
            }

            /* Consume header (see ZSTDds_decodeFrameHeader) */
            DEBUGLOG(4, "Consume header");
            FORWARD_IF_ERROR(ZSTD_decompressBegin_usingDDict(zds, ZSTD_getDDict(zds)), "");

            if ((MEM_readLE32(zds->headerBuffer) & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {  /* skippable frame */
                zds->expected = MEM_readLE32(zds->headerBuffer + ZSTD_FRAMEIDSIZE);
                zds->stage = ZSTDds_skipFrame;
            } else {
                FORWARD_IF_ERROR(ZSTD_decodeFrameHeader(zds, zds->headerBuffer, zds->lhSize), "");
                zds->expected = ZSTD_blockHeaderSize;
                zds->stage = ZSTDds_decodeBlockHeader;
            }

            /* control buffer memory usage */
            DEBUGLOG(4, "Control max memory usage (%u KB <= max %u KB)",
                        (U32)(zds->fParams.windowSize >>10),
                        (U32)(zds->maxWindowSize >> 10) );
            zds->fParams.windowSize = MAX(zds->fParams.windowSize, 1U << ZSTD_WINDOWLOG_ABSOLUTEMIN);
            RETURN_ERROR_IF(zds->fParams.windowSize > zds->maxWindowSize,
                            frameParameter_windowTooLarge, "");

            /* Adapt buffer sizes to frame header instructions */
            {   size_t const neededInBuffSize = MAX(zds->fParams.blockSizeMax, 4 /* frame checksum */);
                size_t const neededOutBuffSize = zds->outBufferMode == ZSTD_bm_buffered
                        ? ZSTD_decodingBufferSize_min(zds->fParams.windowSize, zds->fParams.frameContentSize)
                        : 0;

                ZSTD_DCtx_updateOversizedDuration(zds, neededInBuffSize, neededOutBuffSize);

                {   int const tooSmall = (zds->inBuffSize < neededInBuffSize) || (zds->outBuffSize < neededOutBuffSize);
                    int const tooLarge = ZSTD_DCtx_isOversizedTooLong(zds);

                    if (tooSmall || tooLarge) {
                        size_t const bufferSize = neededInBuffSize + neededOutBuffSize;
                        DEBUGLOG(4, "inBuff  : from %u to %u",
                                    (U32)zds->inBuffSize, (U32)neededInBuffSize);
                        DEBUGLOG(4, "outBuff : from %u to %u",
                                    (U32)zds->outBuffSize, (U32)neededOutBuffSize);
                        if (zds->staticSize) {  /* static DCtx */
                            DEBUGLOG(4, "staticSize : %u", (U32)zds->staticSize);
                            assert(zds->staticSize >= sizeof(ZSTD_DCtx));  /* controlled at init */
                            RETURN_ERROR_IF(
                                bufferSize > zds->staticSize - sizeof(ZSTD_DCtx),
                                memory_allocation, "");
                        } else {
                            ZSTD_customFree(zds->inBuff, zds->customMem);
                            zds->inBuffSize = 0;
                            zds->outBuffSize = 0;
                            zds->inBuff = (char*)ZSTD_customMalloc(bufferSize, zds->customMem);
                            RETURN_ERROR_IF(zds->inBuff == NULL, memory_allocation, "");
                        }
                        zds->inBuffSize = neededInBuffSize;
                        zds->outBuff = zds->inBuff + zds->inBuffSize;
                        zds->outBuffSize = neededOutBuffSize;
            }   }   }
            zds->streamStage = zdss_read;
            /* fall-through */

        case zdss_read:
            DEBUGLOG(5, "stage zdss_read");
            {   size_t const neededInSize = ZSTD_nextSrcSizeToDecompressWithInputSize(zds, (size_t)(iend - ip));
                DEBUGLOG(5, "neededInSize = %u", (U32)neededInSize);
                if (neededInSize==0) {  /* end of frame */
                    zds->streamStage = zdss_init;
                    someMoreWork = 0;
                    break;
                }
                if ((size_t)(iend-ip) >= neededInSize) {  /* decode directly from src */
                    FORWARD_IF_ERROR(ZSTD_decompressContinueStream(zds, &op, oend, ip, neededInSize), "");
                    ip += neededInSize;
                    /* Function modifies the stage so we must break */
                    break;
            }   }
            if (ip==iend) { someMoreWork = 0; break; }   /* no more input */
            zds->streamStage = zdss_load;
            /* fall-through */

        case zdss_load:
            {   size_t const neededInSize = ZSTD_nextSrcSizeToDecompress(zds);
                size_t const toLoad = neededInSize - zds->inPos;
                int const isSkipFrame = ZSTD_isSkipFrame(zds);
                size_t loadedSize;
                /* At this point we shouldn't be decompressing a block that we can stream. */
                assert(neededInSize == ZSTD_nextSrcSizeToDecompressWithInputSize(zds, iend - ip));
                if (isSkipFrame) {
                    loadedSize = MIN(toLoad, (size_t)(iend-ip));
                } else {
                    RETURN_ERROR_IF(toLoad > zds->inBuffSize - zds->inPos,
                                    corruption_detected,
                                    "should never happen");
                    loadedSize = ZSTD_limitCopy(zds->inBuff + zds->inPos, toLoad, ip, (size_t)(iend-ip));
                }
                ip += loadedSize;
                zds->inPos += loadedSize;
                if (loadedSize < toLoad) { someMoreWork = 0; break; }   /* not enough input, wait for more */

                /* decode loaded input */
                zds->inPos = 0;   /* input is consumed */
                FORWARD_IF_ERROR(ZSTD_decompressContinueStream(zds, &op, oend, zds->inBuff, neededInSize), "");
                /* Function modifies the stage so we must break */
                break;
            }
        case zdss_flush:
            {   size_t const toFlushSize = zds->outEnd - zds->outStart;
                size_t const flushedSize = ZSTD_limitCopy(op, (size_t)(oend-op), zds->outBuff + zds->outStart, toFlushSize);
                op += flushedSize;
                zds->outStart += flushedSize;
                if (flushedSize == toFlushSize) {  /* flush completed */
                    zds->streamStage = zdss_read;
                    if ( (zds->outBuffSize < zds->fParams.frameContentSize)
                      && (zds->outStart + zds->fParams.blockSizeMax > zds->outBuffSize) ) {
                        DEBUGLOG(5, "restart filling outBuff from beginning (left:%i, needed:%u)",
                                (int)(zds->outBuffSize - zds->outStart),
                                (U32)zds->fParams.blockSizeMax);
                        zds->outStart = zds->outEnd = 0;
                    }
                    break;
            }   }
            /* cannot complete flush */
            someMoreWork = 0;
            break;

        default:
            assert(0);    /* impossible */
            RETURN_ERROR(GENERIC, "impossible to reach");   /* some compiler require default to do something */
    }   }

    /* result */
    input->pos = (size_t)(ip - (const char*)(input->src));
    output->pos = (size_t)(op - (char*)(output->dst));

    /* Update the expected output buffer for ZSTD_obm_stable. */
    zds->expectedOutBuffer = *output;

    if ((ip==istart) && (op==ostart)) {  /* no forward progress */
        zds->noForwardProgress ++;
        if (zds->noForwardProgress >= ZSTD_NO_FORWARD_PROGRESS_MAX) {
            RETURN_ERROR_IF(op==oend, dstSize_tooSmall, "");
            RETURN_ERROR_IF(ip==iend, srcSize_wrong, "");
            assert(0);
        }
    } else {
        zds->noForwardProgress = 0;
    }
    {   size_t nextSrcSizeHint = ZSTD_nextSrcSizeToDecompress(zds);
        if (!nextSrcSizeHint) {   /* frame fully decoded */
            if (zds->outEnd == zds->outStart) {  /* output fully flushed */
                if (zds->hostageByte) {
                    if (input->pos >= input->size) {
                        /* can't release hostage (not present) */
                        zds->streamStage = zdss_read;
                        return 1;
                    }
                    input->pos++;  /* release hostage */
                }   /* zds->hostageByte */
                return 0;
            }  /* zds->outEnd == zds->outStart */
            if (!zds->hostageByte) { /* output not fully flushed; keep last byte as hostage; will be released when all output is flushed */
                input->pos--;   /* note : pos > 0, otherwise, impossible to finish reading last block */
                zds->hostageByte=1;
            }
            return 1;
        }  /* nextSrcSizeHint==0 */
        nextSrcSizeHint += ZSTD_blockHeaderSize * (ZSTD_nextInputType(zds) == ZSTDnit_block);   /* preload header of next block */
        assert(zds->inPos <= nextSrcSizeHint);
        nextSrcSizeHint -= zds->inPos;   /* part already loaded*/
        return nextSrcSizeHint;
    }
}